

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaSetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  CppType CVar1;
  Extension *pEVar2;
  LogMessage *pLVar3;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar4;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (message == (MessageLite *)0x0) {
    ClearExtension(this,number);
    return;
  }
  pVar4 = Insert(this,number);
  pEVar2 = pVar4.first;
  pEVar2->descriptor = descriptor;
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar2->is_repeated != false) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2dc);
      pLVar3 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=(&local_61,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
    CVar1 = anon_unknown_26::cpp_type(pEVar2->type);
    if (CVar1 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2dc);
      pLVar3 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_61,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
    if ((pEVar2->field_0xa & 0x10) != 0) {
      (*((pEVar2->field_0).message_value)->_vptr_MessageLite[6])
                ((pEVar2->field_0).message_value,message,this->arena_);
      goto LAB_003c3c3a;
    }
    if ((this->arena_ == (Arena *)0x0) && ((pEVar2->field_0).message_value != (MessageLite *)0x0)) {
      (*((pEVar2->field_0).message_value)->_vptr_MessageLite[1])();
    }
  }
  else {
    pEVar2->type = type;
    CVar1 = anon_unknown_26::cpp_type(type);
    if (CVar1 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2d7);
      pLVar3 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_61,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
    pEVar2->is_repeated = false;
    pEVar2->field_0xa = pEVar2->field_0xa & 0xf;
  }
  (pEVar2->field_0).message_value = message;
LAB_003c3c3a:
  pEVar2->field_0xa = pEVar2->field_0xa & 0xf0;
  return;
}

Assistant:

void ExtensionSet::UnsafeArenaSetAllocatedMessage(
    int number, FieldType type, const FieldDescriptor* descriptor,
    MessageLite* message) {
  if (message == nullptr) {
    ClearExtension(number);
    return;
  }
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    extension->message_value = message;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->lazymessage_value->UnsafeArenaSetAllocatedMessage(message,
                                                                   arena_);
    } else {
      if (arena_ == nullptr) {
        delete extension->message_value;
      }
      extension->message_value = message;
    }
  }
  extension->is_cleared = false;
}